

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void RadialFetchPlain<GradientBaseFP>::fetch
               (BlendType *buffer,BlendType *end,Operator *op,QSpanData *data,qreal det,
               qreal delta_det,qreal delta_delta_det,qreal b,qreal delta_b)

{
  double dVar1;
  BlendType BVar2;
  
  if ((op->field_16).radial.extended == false) {
    for (; buffer < end; buffer = buffer + 1) {
      BVar2 = (BlendType)ZEXT816(0);
      if (det >= 0.0) {
        if (det < 0.0) {
          dVar1 = sqrt(det);
        }
        else {
          dVar1 = SQRT(det);
        }
        BVar2 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar1 - b);
      }
      *buffer = BVar2;
      det = det + delta_det;
      delta_det = delta_det + delta_delta_det;
      b = b + delta_b;
    }
  }
  else {
    for (; buffer < end; buffer = buffer + 1) {
      if (det < 0.0) {
        BVar2 = (BlendType)ZEXT816(0);
      }
      else {
        if (det < 0.0) {
          dVar1 = sqrt(det);
        }
        else {
          dVar1 = SQRT(det);
        }
        BVar2 = (BlendType)ZEXT816(0);
        if (0.0 <= (op->field_16).linear.l * (dVar1 - b) + *(double *)((long)&data->field_23 + 0x30)
           ) {
          BVar2 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar1 - b);
        }
      }
      *buffer = BVar2;
      det = det + delta_det;
      delta_det = delta_det + delta_delta_det;
      b = b + delta_b;
    }
  }
  return;
}

Assistant:

static void fetch(BlendType *buffer, BlendType *end,
                      const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        if (op->radial.extended) {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    if (data->gradient.radial.focal.radius + op->radial.dr * w >= 0)
                        result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;

                ++buffer;
            }
        } else {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer++ = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;
            }
        }
    }